

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O1

bool __thiscall MP1Node::heartbeatRepHandler(MP1Node *this,void *env,char *data,int size)

{
  Member **__return_storage_ptr__;
  short sVar1;
  int iVar2;
  MP1Node *pMVar3;
  pointer this_00;
  bool bVar4;
  Address replierAddr;
  Address local_78;
  MP1Node local_70;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"start heartbeatRepHandler...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (size < 6) {
    bVar4 = false;
  }
  else {
    local_78.addr._4_2_ = *(undefined2 *)(data + 4);
    local_78.addr._0_4_ = *(undefined4 *)data;
    __return_storage_ptr__ = &local_70.memberNode;
    pMVar3 = (MP1Node *)__return_storage_ptr__;
    Address::getAddress_abi_cxx11_((string *)__return_storage_ptr__,&local_78);
    iVar2 = getIdFromAddress(pMVar3,(string *)__return_storage_ptr__);
    if (local_70.memberNode != (Member *)&stack0xffffffffffffffc0) {
      operator_delete(local_70.memberNode);
    }
    pMVar3 = &local_70;
    Address::getAddress_abi_cxx11_((string *)&local_70,&local_78);
    sVar1 = getPortFromAddress(pMVar3,(string *)&local_70);
    if ((Log **)local_70._vptr_MP1Node != &local_70.log) {
      operator_delete(local_70._vptr_MP1Node);
    }
    for (this_00 = (this->memberNode->memberList).
                   super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                   super__Vector_impl_data._M_start;
        bVar4 = this_00 !=
                (this->memberNode->memberList).
                super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                super__Vector_impl_data._M_finish, bVar4; this_00 = this_00 + 1) {
      if ((this_00->id == iVar2) && (this_00->port == sVar1)) {
        iVar2 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(this_00,(long)iVar2);
        this_00->heartbeat = this_00->heartbeat + 1;
        return bVar4;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"...end heartbeatRepHandler.",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  return bVar4;
}

Assistant:

bool MP1Node::heartbeatRepHandler(void *env, char *data, int size) {
    cout << "start heartbeatRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(&replierAddr.addr, data, sizeof(memberNode->addr.addr));

    int id = getIdFromAddress(replierAddr.getAddress());
    short port = getPortFromAddress(replierAddr.getAddress());

    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end(); entry++) {
        if (entry->id == id && entry->port == port) {
            entry->settimestamp( par->getcurrtime() );
            entry->heartbeat = entry->heartbeat + 1;
            return true;
        }
    }

    cout << "...end heartbeatRepHandler." << endl;
    return false;
}